

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O1

void remove_expired(CookieInfo *ci)

{
  long lVar1;
  time_t tVar2;
  Curl_llist_node *n;
  Cookie *co;
  Curl_llist_node *pCVar3;
  long lVar4;
  
  tVar2 = time((time_t *)0x0);
  if (ci->next_expiration <= tVar2 || ci->next_expiration == 0x7fffffffffffffff) {
    ci->next_expiration = 0x7fffffffffffffff;
    lVar4 = 0;
    do {
      n = Curl_llist_head(ci->cookielist + lVar4);
      while (n != (Curl_llist_node *)0x0) {
        co = (Cookie *)Curl_node_elem(n);
        pCVar3 = Curl_node_next(n);
        lVar1 = co->expires;
        if (lVar1 < tVar2 && lVar1 != 0) {
          Curl_node_remove(n);
          freecookie(co);
          ci->numcookies = ci->numcookies + -1;
          n = pCVar3;
        }
        else {
          n = pCVar3;
          if ((lVar1 != 0) && (lVar1 < ci->next_expiration)) {
            ci->next_expiration = lVar1;
          }
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x3f);
  }
  return;
}

Assistant:

static void remove_expired(struct CookieInfo *ci)
{
  struct Cookie *co;
  curl_off_t now = (curl_off_t)time(NULL);
  unsigned int i;

  /*
   * If the earliest expiration timestamp in the jar is in the future we can
   * skip scanning the whole jar and instead exit early as there will not be
   * any cookies to evict. If we need to evict however, reset the
   * next_expiration counter in order to track the next one. In case the
   * recorded first expiration is the max offset, then perform the safe
   * fallback of checking all cookies.
   */
  if(now < ci->next_expiration &&
     ci->next_expiration != CURL_OFF_T_MAX)
    return;
  else
    ci->next_expiration = CURL_OFF_T_MAX;

  for(i = 0; i < COOKIE_HASH_SIZE; i++) {
    struct Curl_llist_node *n;
    struct Curl_llist_node *e = NULL;

    for(n = Curl_llist_head(&ci->cookielist[i]); n; n = e) {
      co = Curl_node_elem(n);
      e = Curl_node_next(n);
      if(co->expires && co->expires < now) {
        Curl_node_remove(n);
        freecookie(co);
        ci->numcookies--;
      }
      else {
        /*
         * If this cookie has an expiration timestamp earlier than what we
         * have seen so far then record it for the next round of expirations.
         */
        if(co->expires && co->expires < ci->next_expiration)
          ci->next_expiration = co->expires;
      }
    }
  }
}